

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiColumnsSet::Clear(ImGuiColumnsSet *this)

{
  ImGuiColumnData *pIVar1;
  
  this->Current = 0;
  this->Count = 1;
  this->ID = 0;
  this->Flags = 0;
  this->IsFirstFrame = false;
  this->IsBeingResized = false;
  this->MinX = 0.0;
  this->MaxX = 0.0;
  this->LineMinY = 0.0;
  this->LineMaxY = 0.0;
  this->StartPosY = 0.0;
  this->StartMaxPosX = 0.0;
  pIVar1 = (this->Columns).Data;
  if (pIVar1 != (ImGuiColumnData *)0x0) {
    (this->Columns).Size = 0;
    (this->Columns).Capacity = 0;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pIVar1,GImAllocatorUserData);
    (this->Columns).Data = (ImGuiColumnData *)0x0;
  }
  return;
}

Assistant:

void Clear()
    {
        ID = 0;
        Flags = 0;
        IsFirstFrame = false;
        IsBeingResized = false;
        Current = 0;
        Count = 1;
        MinX = MaxX = 0.0f;
        LineMinY = LineMaxY = 0.0f;
        StartPosY = 0.0f;
        StartMaxPosX = 0.0f;
        Columns.clear();
    }